

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::shrink
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this,size_t newSize)

{
  size_t sVar1;
  bool bVar2;
  size_t newSize_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this_local;
  
  if (newSize == 0) {
    clear(this);
  }
  else {
    checkAssertion(newSize <= this->numActive,"newSize <= numActive","shrink",0xff);
    while( true ) {
      bVar2 = false;
      if (newSize < this->numActive) {
        bVar2 = this->numActive != 0;
      }
      if (!bVar2) break;
      sVar1 = this->numActive - 1;
      this->numActive = sVar1;
      pool_ref<soul::AST::Expression>::~pool_ref(this->items + sVar1);
    }
  }
  return;
}

Assistant:

void shrink (size_t newSize)
    {
        if (newSize == 0)
            return clear();

        SOUL_ASSERT (newSize <= numActive);

        while (newSize < numActive && numActive > 0)
            items[--numActive].~Item();
    }